

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O3

void floaxie::grisu2<_19,_16,float,char>(float v,char *buffer,int *length,int *K)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  double dVar11;
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  pVar12;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> local_50;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> local_48;
  char *local_40;
  int *local_38;
  
  local_40 = buffer;
  local_38 = length;
  pVar12 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::boundaries(v);
  iVar3 = pVar12.second.m_e;
  if (iVar3 < -0x14) {
    dVar11 = 1.0;
  }
  else {
    dVar11 = 0.0;
  }
  iVar2 = (int)((double)-(iVar3 + 0x14) * 0.30102999566398114 + dVar11);
  if (-0x33 < iVar2) {
    uVar5 = pVar12.first._2_4_ & 0xffff;
    uVar9 = pVar12.first.m_f & 0xffff;
    uVar4 = *(uint *)(powers_ten<float>::f + (long)iVar2 * 4 + 200) >> 0x10;
    uVar6 = *(uint *)(powers_ten<float>::f + (long)iVar2 * 4 + 200) & 0xffff;
    uVar1 = uVar9 * uVar4;
    uVar8 = uVar5 * uVar6;
    iVar10 = ((uVar1 & 0xffff) + 0x8000 + (uVar8 & 0xffff) + (uVar9 * uVar6 >> 0x10) >> 0x10) +
             (uVar1 >> 0x10) + (uVar8 >> 0x10) + uVar5 * uVar4;
    iVar7 = pVar12.first.m_e + *(int *)(powers_ten<float>::e + (long)iVar2 * 4 + 200);
    local_50.m_e = iVar7 + 0x20;
    uVar8 = pVar12.second.m_f >> 0x10;
    uVar1 = pVar12.second.m_f & 0xffff;
    uVar5 = uVar4 * uVar1;
    uVar9 = uVar8 * uVar6;
    uVar1 = ((uVar5 & 0xffff) + 0x8000 + (uVar9 & 0xffff) + (uVar1 * uVar6 >> 0x10) >> 0x10) +
            (uVar5 >> 0x10) + (uVar9 >> 0x10) + uVar8 * uVar4;
    iVar3 = *(int *)(powers_ten<float>::e + (long)iVar2 * 4 + 200) + iVar3;
    local_48.m_e = iVar3 + 0x20;
    if (iVar10 == -1) {
      local_50.m_e = iVar7 + 0x21;
      local_50.m_f = 0x80000000;
    }
    else {
      local_50.m_f = iVar10 + 1;
    }
    if (uVar1 < 2) {
      uVar1 = uVar1 * 2;
      local_48.m_e = iVar3 + 0x1f;
    }
    local_48.m_f = uVar1 - 1;
    *K = -iVar2;
    digit_gen_select<false>::gen<float,char>(&local_48,&local_50,local_40,local_38,K);
    return;
  }
  __assert_fail("k >= -static_cast<int>(powers_ten<FloatType>::pow_0_offset)",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/cached_power.h"
                ,0x2d,"diy_fp<FloatType> floaxie::cached_power(int) [FloatType = float]");
}

Assistant:

inline void grisu2(FloatType v, CharType* buffer, int* length, int* K) noexcept
	{
		static_assert(alpha <= gamma - 3,
			"It's imposed that γ ⩾ α + 3, since otherwise it's not always possible to find a proper decimal cached power");

		std::pair<diy_fp<FloatType>, diy_fp<FloatType>>&& w(diy_fp<FloatType>::boundaries(v));
		diy_fp<FloatType> &w_m(w.first), &w_p(w.second);

		const int mk = k_comp_exp<alpha, gamma>(w_p.exponent());
		const diy_fp<FloatType>& c_mk(cached_power<FloatType>(mk));

		w_m *= c_mk;
		w_p *= c_mk;

		++w_m;
		--w_p;

		*K = -mk;

		digit_gen<alpha, gamma>(w_p, w_m, buffer, length, K);
	}